

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O3

int tlstran_ep_init_dialer(void *arg,nng_url *url,nni_dialer *ndialer)

{
  char cVar1;
  int iVar2;
  nni_sock *sock;
  
  sock = nni_dialer_sock(ndialer);
  tlstran_ep_init((tlstran_ep *)arg,sock,tlstran_dial_cb);
  *(nni_dialer **)((long)arg + 0x68) = ndialer;
  cVar1 = *url->u_path;
  iVar2 = 0xf;
  if (((cVar1 == '\0') || ((cVar1 == '/' && (url->u_path[1] == '\0')))) &&
     ((url->u_fragment == (char *)0x0 &&
      ((((url->u_userinfo == (char *)0x0 && (url->u_query == (char *)0x0)) &&
        (*url->u_hostname != '\0')) && (url->u_port != 0)))))) {
    iVar2 = nng_stream_dialer_alloc_url((nng_stream_dialer **)((long)arg + 0x58),url);
    if (iVar2 == 0) {
      nni_dialer_add_stat(ndialer,(nni_stat_item *)((long)arg + 0x4d0));
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int
tlstran_ep_init_dialer(void *arg, nng_url *url, nni_dialer *ndialer)
{
	tlstran_ep *ep = arg;
	int         rv;
	nni_sock   *sock = nni_dialer_sock(ndialer);

	tlstran_ep_init(ep, sock, tlstran_dial_cb);
	ep->ndialer = ndialer;

	// Check for invalid URL components.
	if ((strlen(url->u_path) != 0) && (strcmp(url->u_path, "/") != 0)) {
		return (NNG_EADDRINVAL);
	}
	if ((url->u_fragment != NULL) || (url->u_userinfo != NULL) ||
	    (url->u_query != NULL) || (strlen(url->u_hostname) == 0) ||
	    (url->u_port == 0)) {
		return (NNG_EADDRINVAL);
	}

	if ((rv = nng_stream_dialer_alloc_url(&ep->dialer, url)) != 0) {
		return (rv);
	}
#ifdef NNG_ENABLE_STATS
	nni_dialer_add_stat(ndialer, &ep->st_rcv_max);
#endif
	return (0);
}